

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O3

LY_ERR lys_compile_type_union
                 (lysc_ctx *ctx,lysp_type *ptypes,lysp_node *context_pnode,uint16_t context_flags,
                 char *context_name,lysc_type ***utypes_p)

{
  int *piVar1;
  lysc_type *type;
  char *pcVar2;
  LY_ERR LVar3;
  long *plVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ly_ctx *ctx_00;
  long lVar9;
  ulong uVar10;
  lysc_type **pplVar11;
  lysc_type **local_68;
  
  local_68 = *utypes_p;
  if (local_68 == (lysc_type **)0x0) {
    lVar7 = *(long *)&ptypes[-1].fraction_digits;
    plVar4 = (long *)calloc(1,lVar7 * 8 + 8);
    if (plVar4 == (long *)0x0) {
      ctx_00 = ctx->ctx;
      local_68 = (lysc_type **)0x0;
      goto LAB_0014bc5e;
    }
    lVar9 = 0;
  }
  else {
    plVar4 = (long *)realloc(local_68 + -1,
                             ((long)&local_68[-1]->name + *(long *)&ptypes[-1].fraction_digits) * 8
                             + 8);
    if (plVar4 == (long *)0x0) {
      ctx_00 = ctx->ctx;
LAB_0014bc5e:
      LVar3 = LY_EMEM;
      ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_union");
      goto LAB_0014bcb0;
    }
    lVar9 = *plVar4;
    lVar7._0_1_ = ptypes[-1].fraction_digits;
    lVar7._1_1_ = ptypes[-1].require_instance;
    lVar7._2_2_ = ptypes[-1].flags;
    lVar7._4_4_ = *(undefined4 *)&ptypes[-1].field_0x64;
  }
  local_68 = (lysc_type **)(plVar4 + 1);
  LVar3 = LY_SUCCESS;
  memset(plVar4 + lVar9 + 1,0,lVar7 * 8);
  if (lVar7 != 0) {
    lVar9 = 8;
    lVar7 = 0;
    uVar10 = 0;
    do {
      pplVar11 = local_68 + lVar7 + uVar10;
      LVar3 = lys_compile_type(ctx,context_pnode,context_flags,context_name,ptypes + uVar10,pplVar11
                               ,(char **)0x0,(lysp_qname **)0x0);
      if (LVar3 != LY_SUCCESS) goto LAB_0014bcb0;
      LOCK();
      (*pplVar11)->refcount = (*pplVar11)->refcount + 1;
      UNLOCK();
      type = *pplVar11;
      pplVar11 = local_68 + -1;
      if (type->basetype == LY_TYPE_UNION) {
        if (type[1].name == (char *)0x0) {
          lVar5 = 0;
        }
        else {
          lVar5 = *(long *)(type[1].name + -8);
        }
        plVar4 = (long *)realloc(pplVar11,(*(long *)&ptypes[-1].fraction_digits + lVar7 + lVar5) * 8
                                          + 8);
        if (plVar4 == (long *)0x0) {
          LVar3 = LY_EMEM;
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_compile_type_union");
          lysc_type_free(&ctx->free_ctx,type);
          goto LAB_0014bcb0;
        }
        if (type[1].name == (char *)0x0) {
          lVar5 = 0;
        }
        else {
          lVar5 = *(long *)(type[1].name + -8);
        }
        local_68 = (lysc_type **)(plVar4 + 1);
        memset(plVar4 + *plVar4 + 1,0,
               (lVar5 + *(long *)&ptypes[-1].fraction_digits + (lVar7 - *plVar4)) * 8);
        uVar6 = 0;
        while( true ) {
          pcVar2 = type[1].name;
          if (pcVar2 == (char *)0x0) {
            uVar8 = 0;
          }
          else {
            uVar8 = *(ulong *)(pcVar2 + -8);
          }
          if (uVar8 <= uVar6) break;
          *(undefined8 *)((long)plVar4 + uVar6 * 8 + lVar9 + lVar7 * 8) =
               *(undefined8 *)(pcVar2 + uVar6 * 8);
          LOCK();
          piVar1 = (int *)(*(long *)(type[1].name + uVar6 * 8) + 0x1c);
          *piVar1 = *piVar1 + 1;
          UNLOCK();
          *plVar4 = *plVar4 + 1;
          uVar6 = uVar6 + 1;
        }
        lVar7 = lVar7 + uVar6 + -1;
        lysc_type_free(&ctx->free_ctx,type);
      }
      else {
        *pplVar11 = (lysc_type *)((long)&(*pplVar11)->name + 1);
      }
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 8;
      uVar6._0_1_ = ptypes[-1].fraction_digits;
      uVar6._1_1_ = ptypes[-1].require_instance;
      uVar6._2_2_ = ptypes[-1].flags;
      uVar6._4_4_ = *(undefined4 *)&ptypes[-1].field_0x64;
    } while (uVar10 < uVar6);
    LVar3 = LY_SUCCESS;
  }
LAB_0014bcb0:
  *utypes_p = local_68;
  return LVar3;
}

Assistant:

static LY_ERR
lys_compile_type_union(struct lysc_ctx *ctx, struct lysp_type *ptypes, struct lysp_node *context_pnode, uint16_t context_flags,
        const char *context_name, struct lysc_type ***utypes_p)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_type **utypes = *utypes_p;
    struct lysc_type_union *un_aux = NULL;

    LY_ARRAY_CREATE_GOTO(ctx->ctx, utypes, LY_ARRAY_COUNT(ptypes), ret, error);
    for (LY_ARRAY_COUNT_TYPE u = 0, additional = 0; u < LY_ARRAY_COUNT(ptypes); ++u) {
        ret = lys_compile_type(ctx, context_pnode, context_flags, context_name, &ptypes[u], &utypes[u + additional],
                NULL, NULL);
        LY_CHECK_GOTO(ret, error);
        LY_ATOMIC_INC_BARRIER(utypes[u + additional]->refcount);

        if (utypes[u + additional]->basetype == LY_TYPE_UNION) {
            /* add space for additional types from the union subtype */
            un_aux = (struct lysc_type_union *)utypes[u + additional];
            LY_ARRAY_CREATE_GOTO(ctx->ctx, utypes,
                    LY_ARRAY_COUNT(ptypes) + additional + LY_ARRAY_COUNT(un_aux->types) - LY_ARRAY_COUNT(utypes), ret, error);

            /* copy subtypes of the subtype union */
            for (LY_ARRAY_COUNT_TYPE v = 0; v < LY_ARRAY_COUNT(un_aux->types); ++v) {
                utypes[u + additional] = un_aux->types[v];
                LY_ATOMIC_INC_BARRIER(un_aux->types[v]->refcount);
                ++additional;
                LY_ARRAY_INCREMENT(utypes);
            }
            /* compensate u increment in main loop */
            --additional;

            /* free the replaced union subtype */
            lysc_type_free(&ctx->free_ctx, (struct lysc_type *)un_aux);
            un_aux = NULL;
        } else {
            LY_ARRAY_INCREMENT(utypes);
        }
    }

    *utypes_p = utypes;
    return LY_SUCCESS;

error:
    if (un_aux) {
        lysc_type_free(&ctx->free_ctx, (struct lysc_type *)un_aux);
    }
    *utypes_p = utypes;
    return ret;
}